

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

void runpushcstr(runcxdef *ctx,char *str,size_t len,int sav)

{
  byte *pbVar1;
  byte bVar2;
  runsdef *prVar3;
  uchar *puVar4;
  byte *pbVar5;
  size_t sVar6;
  long lVar7;
  undefined4 local_2f;
  undefined3 uStack_2b;
  
  pbVar1 = (byte *)(str + len);
  pbVar5 = (byte *)str;
  sVar6 = len;
  if (0 < (long)len) {
    do {
      bVar2 = *pbVar5;
      if (((bVar2 < 0xe) && ((0x2600U >> (bVar2 & 0x1f) & 1) != 0)) || (bVar2 == 0x5c)) {
        sVar6 = sVar6 + 1;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 < pbVar1);
  }
  puVar4 = ctx->runcxhp;
  lVar7 = sVar6 + 2;
  if ((uint)(*(int *)&ctx->runcxhtop - (int)puVar4) <= (uint)lVar7) {
    runhcmp(ctx,(uint)lVar7,sav,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
    puVar4 = ctx->runcxhp;
  }
  *(short *)puVar4 = (short)lVar7;
  puVar4 = ctx->runcxhp;
  if (0 < (long)len) {
    pbVar5 = puVar4 + 2;
    do {
      bVar2 = *str;
      if (bVar2 < 0xd) {
        if (bVar2 == 9) {
          pbVar5[0] = 0x5c;
          pbVar5[1] = 9;
          goto LAB_00135aae;
        }
        if (bVar2 == 10) goto LAB_00135a9b;
LAB_00135aa2:
        *pbVar5 = bVar2;
        pbVar5 = pbVar5 + 1;
      }
      else {
        if (bVar2 == 0xd) {
LAB_00135a9b:
          pbVar5[0] = 0x5c;
          pbVar5[1] = 0x6e;
        }
        else {
          if (bVar2 != 0x5c) goto LAB_00135aa2;
          pbVar5[0] = 0x5c;
          pbVar5[1] = 0x5c;
        }
LAB_00135aae:
        pbVar5 = pbVar5 + 2;
      }
      str = (char *)((byte *)str + 1);
    } while (str < pbVar1);
    puVar4 = ctx->runcxhp;
  }
  ctx->runcxhp = puVar4 + lVar7;
  prVar3 = ctx->runcxsp;
  prVar3->runstyp = '\x03';
  *(undefined4 *)&prVar3->field_0x1 = local_2f;
  *(uint *)&prVar3->field_0x4 = CONCAT31(uStack_2b,local_2f._3_1_);
  (prVar3->runsv).runsvstr = puVar4;
  ctx->runcxsp = ctx->runcxsp + 1;
  return;
}

Assistant:

void runpushcstr(runcxdef *ctx, char *str, size_t len, int sav)
{
    char    *p;
    char    *dst;
    size_t   need;
    runsdef  val;
    
    /* determine how much space we'll need after converting escapes */
    for (p = str, need = len ; p < str + len ; ++p)
    {
        switch(*p)
        {
        case '\\':
        case '\n':
        case '\r':
        case '\t':
            /* these characters need to be escaped */
            ++need;
            break;

        default:
            break;
        }
    }

    /* reserve space */
    runhres(ctx, need + 2, sav);

    /* set up the length prefix */
    oswp2(ctx->runcxhp, need + 2);

    /* copy the string, expanding escapes */
    for (p = str, dst = (char *)ctx->runcxhp + 2 ; p < str + len ; ++p)
    {
        switch(*p)
        {
        case '\\':
            *dst++ = '\\';
            *dst++ = '\\';
            break;

        case '\n':
        case '\r':
            *dst++ = '\\';
            *dst++ = 'n';
            break;

        case '\t':
            *dst++ = '\\';
            *dst++ = '\t';
            break;

        default:
            *dst++ = *p;
            break;
        }
    }

    /* push the return value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_SSTRING;
    ctx->runcxhp += need + 2;
    runrepush(ctx, &val);
}